

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdgroupsimple.h
# Opt level: O1

void FastPForLib::SIMDGroupSimple<false,_false>::encodeArrayInternal_woRingBuf
               (uint32_t *in,size_t len,uint32_t *out,size_t *nvalue)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  bool bVar5;
  void *pvVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  uint32_t *puVar12;
  int iVar13;
  uint32_t *puVar14;
  byte bVar15;
  long lVar16;
  long in_R10;
  long in_R11;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  __m128i alVar38;
  __m128i *outDataArea128;
  uint8_t local_81;
  __m128i *local_80;
  __m128i *local_78;
  long local_70;
  uint32_t *local_68;
  uint32_t *local_60;
  __m128i *local_58;
  long local_50;
  long local_48;
  size_t local_40;
  ulong *local_38;
  undefined1 auVar21 [32];
  
  uVar17 = len >> 2 & 0xfffffffffffffff;
  local_38 = nvalue;
  pvVar6 = operator_new__(uVar17 * 4);
  if (len != 0) {
    auVar26 = vpbroadcastq_avx512f();
    uVar8 = (len - 1 >> 2) + 0x10 & 0xfffffffffffffff0;
    auVar26 = vpsrlq_avx512f(auVar26,2);
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x3c3834302c282420));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x1c1814100c080400));
    uVar9 = 0;
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar31 = vpbroadcastq_avx512f(ZEXT816(2));
    auVar32 = vpbroadcastq_avx512f(ZEXT816(1));
    auVar33 = vpbroadcastq_avx512f(ZEXT816(3));
    auVar34 = vpbroadcastq_avx512f(ZEXT816(0x40));
    do {
      auVar35 = vpbroadcastq_avx512f();
      auVar36 = vporq_avx512f(auVar35,auVar29);
      auVar35 = vporq_avx512f(auVar35,auVar30);
      uVar19 = vpcmpuq_avx512f(auVar35,auVar26,2);
      uVar20 = vpcmpuq_avx512f(auVar36,auVar26,2);
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + uVar8));
      bVar15 = (byte)uVar20;
      auVar22._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar21._4_4_;
      auVar22._0_4_ = (uint)(bVar15 & 1) * auVar21._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar21._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar21._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar21._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar21._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar21._24_4_;
      auVar22._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar21._28_4_;
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + uVar9));
      bVar2 = (byte)uVar19;
      auVar35 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar19 >> 7) * auVar21._28_4_,
                                              CONCAT424((uint)((byte)(uVar19 >> 6) & 1) *
                                                        auVar21._24_4_,
                                                        CONCAT420((uint)((byte)(uVar19 >> 5) & 1) *
                                                                  auVar21._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar19 >>
                                                                                         4) & 1) *
                                                                            auVar21._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar19 >> 3) & 1) * auVar21._12_4_,
                                                  CONCAT48((uint)((byte)(uVar19 >> 2) & 1) *
                                                           auVar21._8_4_,
                                                           CONCAT44((uint)((byte)(uVar19 >> 1) & 1)
                                                                    * auVar21._4_4_,
                                                                    (uint)(bVar2 & 1) *
                                                                    auVar21._0_4_)))))))),auVar22,1)
      ;
      vporq_avx512f(auVar28,auVar32);
      vporq_avx512f(auVar27,auVar32);
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar23._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar21._4_4_;
      auVar23._0_4_ = (uint)(bVar15 & 1) * auVar21._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar21._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar21._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar21._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar21._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar21._24_4_;
      auVar23._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar21._28_4_;
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R10));
      auVar36 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar19 >> 7) * auVar21._28_4_,
                                              CONCAT424((uint)((byte)(uVar19 >> 6) & 1) *
                                                        auVar21._24_4_,
                                                        CONCAT420((uint)((byte)(uVar19 >> 5) & 1) *
                                                                  auVar21._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar19 >>
                                                                                         4) & 1) *
                                                                            auVar21._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar19 >> 3) & 1) * auVar21._12_4_,
                                                  CONCAT48((uint)((byte)(uVar19 >> 2) & 1) *
                                                           auVar21._8_4_,
                                                           CONCAT44((uint)((byte)(uVar19 >> 1) & 1)
                                                                    * auVar21._4_4_,
                                                                    (uint)(bVar2 & 1) *
                                                                    auVar21._0_4_)))))))),auVar23,1)
      ;
      auVar35 = vpord_avx512f(auVar36,auVar35);
      vporq_avx512f(auVar28,auVar31);
      vporq_avx512f(auVar27,auVar31);
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar24._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar21._4_4_;
      auVar24._0_4_ = (uint)(bVar15 & 1) * auVar21._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar21._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar21._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar21._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar21._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar21._24_4_;
      auVar24._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar21._28_4_;
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R10));
      auVar36 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar19 >> 7) * auVar21._28_4_,
                                              CONCAT424((uint)((byte)(uVar19 >> 6) & 1) *
                                                        auVar21._24_4_,
                                                        CONCAT420((uint)((byte)(uVar19 >> 5) & 1) *
                                                                  auVar21._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar19 >>
                                                                                         4) & 1) *
                                                                            auVar21._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar19 >> 3) & 1) * auVar21._12_4_,
                                                  CONCAT48((uint)((byte)(uVar19 >> 2) & 1) *
                                                           auVar21._8_4_,
                                                           CONCAT44((uint)((byte)(uVar19 >> 1) & 1)
                                                                    * auVar21._4_4_,
                                                                    (uint)(bVar2 & 1) *
                                                                    auVar21._0_4_)))))))),auVar24,1)
      ;
      vporq_avx512f(auVar28,auVar33);
      vporq_avx512f(auVar27,auVar33);
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)((long)in * 5));
      auVar25._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar21._4_4_;
      auVar25._0_4_ = (uint)(bVar15 & 1) * auVar21._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar21._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar21._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar20 >> 4) & 1) * auVar21._16_4_;
      auVar25._20_4_ = (uint)((byte)(uVar20 >> 5) & 1) * auVar21._20_4_;
      auVar25._24_4_ = (uint)((byte)(uVar20 >> 6) & 1) * auVar21._24_4_;
      auVar25._28_4_ = (uint)(byte)(uVar20 >> 7) * auVar21._28_4_;
      auVar21 = vpgatherqd_avx512f(*(undefined8 *)(in + in_R11));
      auVar37 = vinserti64x4_avx512f
                          (ZEXT3264(CONCAT428((uint)(byte)(uVar19 >> 7) * auVar21._28_4_,
                                              CONCAT424((uint)((byte)(uVar19 >> 6) & 1) *
                                                        auVar21._24_4_,
                                                        CONCAT420((uint)((byte)(uVar19 >> 5) & 1) *
                                                                  auVar21._20_4_,
                                                                  CONCAT416((uint)((byte)(uVar19 >>
                                                                                         4) & 1) *
                                                                            auVar21._16_4_,
                                                                            CONCAT412((uint)((byte)(
                                                  uVar19 >> 3) & 1) * auVar21._12_4_,
                                                  CONCAT48((uint)((byte)(uVar19 >> 2) & 1) *
                                                           auVar21._8_4_,
                                                           CONCAT44((uint)((byte)(uVar19 >> 1) & 1)
                                                                    * auVar21._4_4_,
                                                                    (uint)(bVar2 & 1) *
                                                                    auVar21._0_4_)))))))),auVar25,1)
      ;
      auVar35 = vpternlogd_avx512f(auVar37,auVar35,auVar36,0xfe);
      auVar35 = vmovdqu32_avx512f(auVar35);
      *(undefined1 (*) [64])((long)pvVar6 + uVar9 * 4) = auVar35;
      uVar9 = uVar9 + 0x10;
      auVar28 = vpaddq_avx512f(auVar28,auVar34);
      auVar27 = vpaddq_avx512f(auVar27,auVar34);
    } while (uVar8 != uVar9);
  }
  local_60 = out + 3;
  if (uVar17 == 0) {
    bVar7 = false;
    uVar8 = 0;
    puVar12 = local_60;
  }
  else {
    lVar10 = 0;
    puVar14 = local_60;
    bVar5 = true;
    do {
      bVar7 = bVar5;
      lVar16 = 0;
      do {
        uVar9 = (ulong)(byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar16];
        if (uVar17 < (byte)(&SIMDGroupSimple<false,false>::tableNum)[lVar16]) {
          uVar9 = uVar17;
        }
        uVar19 = uVar9 + (uVar9 == 0);
        uVar20 = 0;
        do {
          uVar8 = uVar20;
          if ((uint)(&SIMDGroupSimple<false,false>::tableMask)[lVar16] <
              *(uint *)((long)pvVar6 + uVar20 * 4 + lVar10 * 4)) break;
          uVar20 = uVar20 + 1;
          uVar8 = uVar19;
        } while (uVar19 != uVar20);
        if (uVar8 == uVar9) goto LAB_00129ac7;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 10);
      lVar16 = 10;
LAB_00129ac7:
      bVar15 = (byte)lVar16;
      puVar12 = puVar14;
      if (!bVar7) {
        bVar15 = bVar15 << 4 | (byte)*puVar14;
        puVar12 = (uint32_t *)((long)puVar14 + 1);
      }
      uVar17 = uVar17 - uVar8;
      lVar10 = lVar10 + uVar8;
      *(byte *)puVar14 = bVar15;
      puVar14 = puVar12;
      bVar5 = (bool)(bVar7 ^ 1);
    } while (uVar17 != 0);
  }
  uVar9 = (ulong)bVar7;
  pbVar1 = (byte *)((long)puVar12 + uVar9);
  bVar15 = (byte)uVar8;
  *(byte *)((long)puVar12 + uVar9) = bVar15;
  local_68 = out;
  local_40 = len;
  operator_delete__(pvVar6);
  local_48 = (long)pbVar1 - (long)local_60;
  local_70 = local_48 * 2 - uVar9;
  uVar17 = (ulong)((uint)(local_48 + 0xd) & 0xf);
  local_50 = 0x10 - uVar17;
  if (uVar17 == 0) {
    local_50 = 0;
  }
  local_78 = (__m128i *)(pbVar1 + local_50 + 1);
  local_58 = local_78;
  if (uVar17 != 0) {
    pbVar11 = (byte *)((long)puVar12 + uVar9 + 1);
    if (pbVar11 < pbVar1 + local_50) {
      pbVar11 = pbVar1 + local_50;
    }
    memset((void *)(local_48 + 0xd + (long)local_68),0,(long)pbVar11 - (long)pbVar1);
  }
  puVar12 = local_60;
  local_80 = (__m128i *)in;
  if (1 < (int)local_70) {
    uVar18 = (int)local_70 - 1;
    uVar17 = 0;
    do {
      bVar2 = *(byte *)((long)puVar12 + (uVar17 >> 1));
      bVar4 = bVar2 >> 4;
      if ((uVar17 & 1) == 0) {
        bVar4 = bVar2 & 0xf;
      }
      local_81 = (&SIMDGroupSimple<false,false>::tableNum)[bVar4];
      comprCompleteBlock(&local_81,&local_80,&local_78);
      uVar17 = uVar17 + 1;
    } while (uVar18 != uVar17);
  }
  if (bVar15 != 0) {
    alVar38 = *local_80;
    if (bVar15 != 1) {
      lVar10 = (uVar8 & 0xff) - 1;
      iVar13 = 1;
      do {
        local_80 = local_80 + 1;
        auVar3 = vpslld_avx((undefined1  [16])*local_80,ZEXT416(iVar13 * (uint)(0x20 / bVar15)));
        alVar38 = (__m128i)vpor_avx((undefined1  [16])alVar38,auVar3);
        iVar13 = iVar13 + 1;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    *local_78 = alVar38;
    local_78 = local_78 + 1;
  }
  *local_68 = (uint32_t)local_40;
  local_68[1] = (uint32_t)local_70;
  local_68[2] = (uint32_t)local_48;
  *local_38 = (ulong)((((int)local_50 + (uint32_t)local_48) - (int)local_58) + 0x10 + (int)local_78
                     >> 2);
  return;
}

Assistant:

inline static void encodeArrayInternal_woRingBuf(const uint32_t *in,
                                                         const size_t len,
                                                         uint32_t *out,
                                                         size_t &nvalue) {
            // The start of the header.
            uint32_t *const outHeader32 = out;
            // The start of the selectors area.
            uint8_t *outSelArea8 =
                    reinterpret_cast<uint8_t *>(outHeader32 + countHeader32);
            uint8_t *const initOutSelArea8 = outSelArea8;

            // The number of input quads, i.e., groups of four integers. Note that we
            // assume the number of input integers to be a multiple of four.
            const size_t countIn128 = len * sizeof(uint32_t) / sizeof(__m128i);

            // Step 1: Generation of the quad max array
            // ========================================
            uint32_t *quadMaxArray = new uint32_t[countIn128];
            for (size_t i = 0; i < len; i += 4) {
                const uint32_t pseudoQuadMax = in[i] | in[i + 1] | in[i + 2] | in[i + 3];
                quadMaxArray[i >> 2] = pseudoQuadMax;
            }

            // Step 2: Pattern selection algorithm
            // ===================================
            // As described in the paper.
            size_t l = countIn128;
            size_t j = 0;
            size_t pos = 0;
            // Whether we have an even number of selectors so far.
            bool even = true;
            while (l > 0) {
                uint8_t i;
                for (i = 0; i <= 9; i++) {
                    const uint8_t n = tableNum[i];
                    // Unlike the original pattern selection algorithm, we look up the mask
                    // directly instead of calculating it from a looked up bit width.
                    const uint32_t mask = tableMask[i];
                    pos = 0;
                    const size_t maxPos = std::min(static_cast<size_t>(n), l);
                    while (pos < maxPos && quadMaxArray[j + pos] <= mask)
                        pos++;
                    if (pos == maxPos)
                        break;
                }
                l -= pos;
                j += pos;
                // Store the selector.
                if (even)
                    *outSelArea8 = i;
                else
                    *outSelArea8++ |= (i << 4);
                even = !even;
            }
            if (!even)
                // The last used byte in the selectors area was touched, but not finished.
                outSelArea8++;
            // The number of quads in the last block.
            const uint8_t countQuadsLastBlock = static_cast<uint8_t>(pos);
            *outSelArea8 = countQuadsLastBlock;

            delete[] quadMaxArray;

            // The number of bytes actually used for the selectors area.
            const size_t countSelArea8Used = outSelArea8 - initOutSelArea8;
            // The total number of selectors.
            const int countSels = int(countSelArea8Used * 2 - (even ? 0 : 1));

            // The number of bytes that could be required for the selectors area in the
            // worst case.
            const size_t countSelArea8WorstCase = countIn128 / 2 + (countIn128 & 1);

            // Depending on whether we want to leave the "pessimistic gap" between the
            // selectors area and the data area, we either reserve the true or the
            // worst-case number of bytes for the selectors area. Note that this has no
            // effect on the amount of data that we actually have to write.
            const size_t countSelArea8 =
                    pessimisticGap ? countSelArea8WorstCase : countSelArea8Used;

            const size_t countPadBytes = getCountPadBytes(countSelArea8);
            // The start of the data area.
            __m128i *outDataArea128 = reinterpret_cast<__m128i *>(initOutSelArea8 +
                                                                  countSelArea8 + sizeof(uint8_t) + countPadBytes);
            const __m128i *const initOutDataArea128 = outDataArea128;
            uint8_t *pad8 = (uint8_t *) outDataArea128 - countPadBytes;
            while (pad8 < (uint8_t *) outDataArea128)
                *pad8++ = 0; // clear padding bytes

            const __m128i *in128 = reinterpret_cast<const __m128i *>(in);

            // Step 3: Packing the uncompressed integers
            // =========================================
            // Iterate over the selectors obtained from the pattern selection algorithm
            // and compress the blocks accordingly. The last block is always treated
            // specially, since it might not be "full".
            for (int m = 0; m < countSels - 1; m++) {
                const uint8_t i = extractSel(initOutSelArea8, m);
                const size_t n = tableNum[i];
                comprCompleteBlock(uint8_t(n), in128, outDataArea128);
            }
            if (countQuadsLastBlock)
                comprIncompleteBlock(countQuadsLastBlock, in128, outDataArea128);

            // Write some meta data to the header.
            outHeader32[0] = uint32_t(len);
            outHeader32[1] = uint32_t(countSels);
            outHeader32[2] = uint32_t(countSelArea8);

            // The position of the last byte written to the output relative to the
            // start of the output. Note that the actual number of written bytes might
            // be slightly lower due to the inserted padding. However, it might even be
            // significantly lower, if pessimisticGap is true.
            const size_t nbytes = countHeader32 * sizeof(uint32_t) +
                                  countSelArea8 + sizeof(uint8_t) + countPadBytes +
                                  (outDataArea128 - initOutDataArea128) * sizeof(__m128i);
            // Rounding the number of bytes to full 32-bit integers.
            nvalue = div_roundup(uint32_t(nbytes), sizeof(uint32_t));
        }